

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O1

AnalogConsumer_python * __thiscall
PythonModuleClient::subanalogdata_python(PythonModuleClient *this,size_t buffersize,list *l)

{
  SubType SVar1;
  network_pimpl *this_00;
  AnalogConsumer_python *this_01;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  undefined1 local_3e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  int local_3b0;
  string local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  HFParsingInfo local_370;
  undefined1 local_330 [144];
  SubType local_2a0;
  undefined4 uStack_29c;
  hfs_data_callback_fn p_Stack_298;
  void *pvStack_290;
  HighFreqDataType local_288;
  HighFreqDataType local_1f8;
  HighFreqDataType local_168;
  HFSubSockSettings local_d8;
  
  this_00 = (this->super_AbstractModuleClient).super_MlmWrap.state;
  local_330._0_8_ = local_330 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"analogstream","");
  local_3e8._0_8_ = local_3e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Trodes","");
  network_pimpl::find_hfdt(&local_288,this_00,(string *)local_330,(string *)local_3e8);
  if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
    operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
  }
  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  listToVec<std::__cxx11::string>(&local_388,l);
  HighFreqDataType::getDataFormat_abi_cxx11_(&local_3a8,&local_288);
  MlmWrap::createAnalogParsingInfo((HFParsingInfo *)local_3e8,(MlmWrap *)this,&local_388,&local_3a8)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_388);
  this_01 = (AnalogConsumer_python *)operator_new(0x480);
  HighFreqDataType::HighFreqDataType(&local_168,&local_288);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_370.indices,(vector<int,_std::allocator<int>_> *)local_3e8);
  local_370.sizeOf = local_3e8._24_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_370.dataRequested,&local_3c8);
  local_370.dataLength = local_3b0;
  AnalogConsumer_python::AnalogConsumer_python(this_01,&local_168,(int)buffersize,&local_370);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_370.dataRequested);
  if (local_370.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_370.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_370.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_370.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  HighFreqDataType::~HighFreqDataType(&local_168);
  HighFreqDataType::HighFreqDataType(&local_1f8,&local_288);
  SVar1 = (this_01->super_AnalogConsumer).super_HFSubConsumer.super_HighFreqSub.sockType;
  HighFreqDataType::HighFreqDataType((HighFreqDataType *)local_330,&local_1f8);
  p_Stack_298 = (hfs_data_callback_fn)0x0;
  pvStack_290 = (void *)0x0;
  local_2a0 = SVar1;
  HighFreqDataType::~HighFreqDataType(&local_1f8);
  MlmWrap::addSubToList((MlmWrap *)this,(HighFreqSub *)this_01);
  HighFreqDataType::HighFreqDataType(&local_d8.dataType,(HighFreqDataType *)local_330);
  local_d8.args = pvStack_290;
  local_d8._148_4_ = uStack_29c;
  local_d8.subSockType = local_2a0;
  local_d8.userFoo = p_Stack_298;
  MlmWrap::addHfTypeToSubbedList((MlmWrap *)this,&local_d8);
  HighFreqDataType::~HighFreqDataType(&local_d8.dataType);
  HighFreqDataType::~HighFreqDataType((HighFreqDataType *)local_330);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c8);
  if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ - local_3e8._0_8_);
  }
  HighFreqDataType::~HighFreqDataType(&local_288);
  return this_01;
}

Assistant:

AnalogConsumer_python* subanalogdata_python(size_t buffersize, list& l){
        HighFreqDataType dt = state->find_hfdt(hfType_ANALOG, TRODES_NETWORK_ID);
        HFParsingInfo parseinfo = createAnalogParsingInfo(listToVec<std::string>(l), dt.getDataFormat());
        AnalogConsumer_python* newsub = new AnalogConsumer_python(dt, buffersize, parseinfo);
        HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
        addSubToList(newsub);
        addHfTypeToSubbedList(sockinfo);
        return newsub;
    }